

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-server.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *file;
  addrinfo *paVar1;
  int iVar2;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *file_00;
  char *pcVar6;
  addrinfo **__pai;
  addrinfo *local_110;
  SSL_CTX *local_108;
  undefined8 local_100;
  addrinfo local_f8;
  _union_1457 local_c8;
  undefined1 local_c0 [144];
  
  if (argc < 4) goto LAB_001027c0;
  memset(local_c0,0,0x90);
  local_c8 = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&local_c8,(sigaction *)0x0);
  pcVar6 = argv[1];
  file_00 = argv[2];
  file = argv[3];
  meth = (SSL_METHOD *)TLS_server_method();
  ctx = SSL_CTX_new(meth);
  if (ctx == (SSL_CTX *)0x0) {
    uVar5 = ERR_get_error();
    file_00 = ERR_error_string(uVar5,(char *)0x0);
    pcVar6 = "Could not create SSL/TLS context: %s";
LAB_00102836:
    errx(1,pcVar6,file_00);
LAB_0010283d:
    pcVar6 = "Could not resolve server address";
  }
  else {
    SSL_CTX_set_options(ctx,0x82030850);
    lVar3 = SSL_CTX_ctrl(ctx,0x5c,0,"P-256");
    if (lVar3 != 1) {
      uVar5 = ERR_get_error();
      file_00 = ERR_error_string(uVar5,(char *)0x0);
      pcVar6 = "SSL_CTX_set1_curves_list failed: %s";
      goto LAB_00102836;
    }
    iVar2 = SSL_CTX_use_PrivateKey_file(ctx,file_00,1);
    if (iVar2 != 1) {
      pcVar6 = "Could not read private key file %s";
      goto LAB_00102836;
    }
    iVar2 = SSL_CTX_use_certificate_chain_file(ctx,file);
    if (iVar2 != 1) {
      pcVar6 = "Could not read certificate file %s";
      file_00 = file;
      goto LAB_00102836;
    }
    SSL_CTX_set_alpn_select_cb(ctx,alpn_select_proto_cb,0);
    uVar4 = event_base_new();
    local_f8.ai_addrlen = 0;
    local_f8._20_4_ = 0;
    local_f8.ai_addr = (sockaddr *)0x0;
    local_f8.ai_canonname = (char *)0x0;
    local_f8.ai_next = (addrinfo *)0x0;
    local_f8.ai_socktype = 1;
    local_f8.ai_protocol = 0;
    local_f8.ai_flags = 0x21;
    local_f8.ai_family = 0;
    __pai = &local_110;
    local_108 = ctx;
    local_100 = uVar4;
    iVar2 = getaddrinfo((char *)0x0,pcVar6,&local_f8,__pai);
    if (iVar2 != 0) goto LAB_0010283d;
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      lVar3 = evconnlistener_new_bind
                        (uVar4,acceptcb,&local_108,10,0x10,paVar1->ai_addr,paVar1->ai_addrlen);
      __pai = &paVar1->ai_next;
      if (lVar3 != 0) {
        freeaddrinfo(local_110);
        event_base_loop(uVar4,0);
        event_base_free(uVar4);
        SSL_CTX_free(ctx);
        return 0;
      }
    }
    pcVar6 = "Could not start listener";
  }
  errx(1,pcVar6);
LAB_001027c0:
  fwrite("Usage: libevent-server PORT KEY_FILE CERT_FILE\n",0x2f,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
  struct sigaction act;

  if (argc < 4) {
    fprintf(stderr, "Usage: libevent-server PORT KEY_FILE CERT_FILE\n");
    exit(EXIT_FAILURE);
  }

  memset(&act, 0, sizeof(struct sigaction));
  act.sa_handler = SIG_IGN;
  sigaction(SIGPIPE, &act, NULL);

  run(argv[1], argv[2], argv[3]);
  return 0;
}